

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeGetUnusedPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,int flags)

{
  MemPage *pMVar1;
  int iVar2;
  
  iVar2 = btreeGetPage(pBt,pgno,ppPage,flags);
  if (iVar2 == 0) {
    pMVar1 = *ppPage;
    if (pMVar1->pDbPage->nRef < 2) {
      pMVar1->isInit = '\0';
    }
    else {
      if (pMVar1 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar1->pDbPage);
      }
      *ppPage = (MemPage *)0x0;
      iVar2 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf0fc,
                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
    }
  }
  else {
    *ppPage = (MemPage *)0x0;
  }
  return iVar2;
}

Assistant:

static int btreeGetUnusedPage(
  BtShared *pBt,       /* The btree */
  Pgno pgno,           /* Number of the page to fetch */
  MemPage **ppPage,    /* Return the page in this parameter */
  int flags            /* PAGER_GET_NOCONTENT or PAGER_GET_READONLY */
){
  int rc = btreeGetPage(pBt, pgno, ppPage, flags);
  if( rc==SQLITE_OK ){
    if( sqlite3PagerPageRefcount((*ppPage)->pDbPage)>1 ){
      releasePage(*ppPage);
      *ppPage = 0;
      return SQLITE_CORRUPT_BKPT;
    }
    (*ppPage)->isInit = 0;
  }else{
    *ppPage = 0;
  }
  return rc;
}